

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O0

int64_t count_time<9,_long>::toCount(baseType val,time_units units)

{
  undefined4 in_ESI;
  long in_RDI;
  long local_8;
  
  switch(in_ESI) {
  case 0:
    local_8 = in_RDI * 1000;
    break;
  case 1:
    local_8 = in_RDI / 1;
    break;
  case 2:
    local_8 = in_RDI / 1000;
    break;
  case 3:
    local_8 = in_RDI / 1000000;
    break;
  case 4:
  case 5:
  default:
    local_8 = seconds(in_RDI);
    break;
  case 6:
    local_8 = in_RDI / 60000000000;
    break;
  case 7:
    local_8 = in_RDI / 3600000000000;
    break;
  case 8:
    local_8 = in_RDI / 86400000000000;
  }
  return local_8;
}

Assistant:

static std::int64_t toCount(baseType val, time_units units) noexcept
    {
        switch (units) {
            case time_units::ps:
                if constexpr (N >= 12) {
                    return static_cast<std::int64_t>(val / fac10[N - 12]);
                } else {
                    return static_cast<std::int64_t>(val * fac10[12 - N]);
                }
            case time_units::ns:
                if constexpr (N >= 9) {
                    return static_cast<std::int64_t>(val / fac10[N - 9]);
                } else {
                    return static_cast<std::int64_t>(val * fac10[9 - N]);
                }
            case time_units::us:
                if constexpr (N >= 6) {
                    return static_cast<std::int64_t>(val / fac10[N - 6]);
                } else {
                    return static_cast<std::int64_t>(val * fac10[6 - N]);
                }
            case time_units::ms:
                if constexpr (N >= 3) {
                    return static_cast<std::int64_t>(val / fac10[N - 3]);
                } else {
                    return static_cast<std::int64_t>(val * fac10[3 - N]);
                }
            case time_units::s:
            case time_units::sec:
            default:
                return seconds(val);
            case time_units::minutes:
                return static_cast<std::int64_t>(val / (iFactor * 60));
            case time_units::hr:
                return static_cast<std::int64_t>(val / (iFactor * 3600));
            case time_units::day:
                return static_cast<std::int64_t>(val / (iFactor * 86400));
        }
    }